

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blur.h
# Opt level: O0

void __thiscall BlurExample::initialize(BlurExample *this)

{
  float sx;
  mat4 o;
  mat4 matrix_00;
  rect2d geometry;
  rect2d geometry_00;
  rect2d geometry_01;
  rect2d geometry_02;
  rect2d geometry_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Renderer *renderer;
  Texture *__p;
  float *pfVar1;
  element_type *peVar2;
  uint *puVar3;
  AnimationManager *this_01;
  TransformNode *this_02;
  Node *pNVar4;
  Node *pNVar5;
  TextureNode *pTVar6;
  rect2d rVar7;
  vec4 local_248;
  vec2 local_238;
  vec2 local_230;
  vec4 local_228;
  vec2 local_218;
  vec2 local_210;
  vec4 local_208;
  vec2 local_1f8;
  vec2 local_1f0;
  vec4 local_1e8;
  vec2 local_1d8;
  vec2 local_1d0;
  vec4 local_1c8;
  vec2 local_1b8;
  vec2 local_1b0;
  vec4 local_1a8;
  vec2 local_198;
  vec2 local_190;
  float local_188 [2];
  float afStack_180 [2];
  float local_178 [2];
  float afStack_170 [2];
  float local_168 [2];
  float afStack_160 [2];
  float local_158 [2];
  float afStack_150 [2];
  float local_148;
  Node *local_138;
  Node *root;
  float afStack_128 [2];
  float local_120 [2];
  float afStack_118 [2];
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  uint local_f0;
  mat4 local_e8;
  undefined1 auStack_a4 [8];
  mat4 matrix;
  undefined1 local_40 [8];
  shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
  a;
  BlurNode *blurNode;
  float local_20;
  float s2;
  float h2;
  float w2;
  vec2 s;
  BlurExample *this_local;
  
  s = (vec2)this;
  renderer = Example::renderer(&this->super_Example);
  __p = ImageUtils::load(renderer,"walker.png");
  std::unique_ptr<rengine::Texture,_std::default_delete<rengine::Texture>_>::reset
            (&this->m_texture,__p);
  _h2 = Example::size(&this->super_Example);
  s2 = h2 * 0.5;
  local_20 = w2 * 0.5;
  pfVar1 = std::min<float>(&s2,&local_20);
  sx = *pfVar1;
  a.
  super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rengine::BlurNode::create(0x25);
  std::
  make_shared<rengine::Animation<rengine::BlurNode,unsigned_int,&rengine::BlurNode::setRadius,&rengine::AnimationCurves::smooth>,rengine::BlurNode*&>
            ((BlurNode **)local_40);
  peVar2 = std::
           __shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  rengine::AbstractAnimation::setDuration(&peVar2->super_AbstractAnimation,2.0);
  peVar2 = std::
           __shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  rengine::AbstractAnimation::setDirection(&peVar2->super_AbstractAnimation,Alternate);
  peVar2 = std::
           __shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  rengine::AbstractAnimation::setIterations(&peVar2->super_AbstractAnimation,-1);
  peVar2 = std::
           __shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  puVar3 = rengine::
           Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame(peVar2,0.0);
  *puVar3 = 0;
  peVar2 = std::
           __shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  puVar3 = rengine::
           Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame(peVar2,1.0);
  *puVar3 = 100;
  this_01 = Example::animationManager(&this->super_Example);
  std::shared_ptr<rengine::AbstractAnimation>::
  shared_ptr<rengine::Animation<rengine::BlurNode,unsigned_int,&rengine::BlurNode::setRadius,&rengine::AnimationCurves::smooth>,void>
            ((shared_ptr<rengine::AbstractAnimation> *)(matrix.m + 0xf),
             (shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
              *)local_40);
  rengine::AnimationManager::start
            (this_01,(shared_ptr<rengine::AbstractAnimation> *)(matrix.m + 0xf),0.0);
  std::shared_ptr<rengine::AbstractAnimation>::~shared_ptr
            ((shared_ptr<rengine::AbstractAnimation> *)(matrix.m + 0xf));
  std::shared_ptr<rengine::AbstractAnimation>::operator=
            (&this->m_animation,
             (shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
              *)local_40);
  rengine::mat4::translate2D(&local_e8,s2,local_20);
  rengine::mat4::scale2D((mat4 *)&root,sx,sx);
  o.m[2] = afStack_128[0];
  o.m[3] = afStack_128[1];
  o.m._0_8_ = root;
  o.m[4] = local_120[0];
  o.m[5] = local_120[1];
  o.m[6] = afStack_118[0];
  o.m[7] = afStack_118[1];
  o.m[8] = local_110[0];
  o.m[9] = local_110[1];
  o.m[10] = afStack_108[0];
  o.m[0xb] = afStack_108[1];
  o.m[0xc] = local_100[0];
  o.m[0xd] = local_100[1];
  o.m[0xe] = afStack_f8[0];
  o.m[0xf] = afStack_f8[1];
  o.type = local_f0;
  rengine::mat4::operator*((mat4 *)auStack_a4,&local_e8,o);
  local_148 = matrix.m[0xe];
  local_158[0] = matrix.m[10];
  local_158[1] = matrix.m[0xb];
  afStack_150[0] = matrix.m[0xc];
  afStack_150[1] = matrix.m[0xd];
  local_168[0] = matrix.m[6];
  local_168[1] = matrix.m[7];
  afStack_160[0] = matrix.m[8];
  afStack_160[1] = matrix.m[9];
  local_178[0] = matrix.m[2];
  local_178[1] = matrix.m[3];
  afStack_170[0] = matrix.m[4];
  afStack_170[1] = matrix.m[5];
  local_188[0] = (float)auStack_a4._0_4_;
  local_188[1] = (float)auStack_a4._4_4_;
  afStack_180[0] = matrix.m[0];
  afStack_180[1] = matrix.m[1];
  matrix_00.m[2] = matrix.m[0];
  matrix_00.m[3] = matrix.m[1];
  matrix_00.m[0] = (float)auStack_a4._0_4_;
  matrix_00.m[1] = (float)auStack_a4._4_4_;
  matrix_00.m[4] = matrix.m[2];
  matrix_00.m[5] = matrix.m[3];
  matrix_00.m[6] = matrix.m[4];
  matrix_00.m[7] = matrix.m[5];
  matrix_00.m[8] = matrix.m[6];
  matrix_00.m[9] = matrix.m[7];
  matrix_00.m[10] = matrix.m[8];
  matrix_00.m[0xb] = matrix.m[9];
  matrix_00.m[0xc] = matrix.m[10];
  matrix_00.m[0xd] = matrix.m[0xb];
  matrix_00.m[0xe] = matrix.m[0xc];
  matrix_00.m[0xf] = matrix.m[0xd];
  matrix_00.type = (uint)matrix.m[0xe];
  this_02 = rengine::TransformNode::create(matrix_00,0.0);
  this_00 = a.
            super___shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  rVar7 = rengine::rect2d::fromXywh(0.15,-0.5,0.3,0.3);
  local_190 = rVar7.br;
  local_198 = rVar7.tl;
  rengine::vec4::vec4(&local_1a8,1.0,0.0,0.0,1.0);
  geometry_03.br = local_190;
  geometry_03.tl = local_198;
  pNVar4 = (Node *)rengine::RectangleNode::create(geometry_03,local_1a8);
  pNVar4 = rengine::Node::operator<<((Node *)this_00._M_pi,pNVar4);
  rVar7 = rengine::rect2d::fromXywh(0.15,-0.15,0.3,0.3);
  local_1b0 = rVar7.br;
  local_1b8 = rVar7.tl;
  rengine::vec4::vec4(&local_1c8,0.0,1.0,0.0,1.0);
  geometry_02.br = local_1b0;
  geometry_02.tl = local_1b8;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_02,local_1c8);
  pNVar4 = rengine::Node::operator<<(pNVar4,pNVar5);
  rVar7 = rengine::rect2d::fromXywh(0.15,0.2,0.3,0.3);
  local_1d0 = rVar7.br;
  local_1d8 = rVar7.tl;
  rengine::vec4::vec4(&local_1e8,0.0,0.0,1.0,1.0);
  geometry_01.br = local_1d0;
  geometry_01.tl = local_1d8;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_01,local_1e8);
  pNVar4 = rengine::Node::operator<<(pNVar4,pNVar5);
  rVar7 = rengine::rect2d::fromXywh(0.5,-0.5,0.3,0.3);
  local_1f0 = rVar7.br;
  local_1f8 = rVar7.tl;
  rengine::vec4::vec4(&local_208,1.0,1.0,0.0,1.0);
  geometry_00.br = local_1f0;
  geometry_00.tl = local_1f8;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry_00,local_208);
  pNVar4 = rengine::Node::operator<<(pNVar4,pNVar5);
  rVar7 = rengine::rect2d::fromXywh(0.5,-0.15,0.3,0.3);
  local_210 = rVar7.br;
  local_218 = rVar7.tl;
  rengine::vec4::vec4(&local_228,0.0,1.0,1.0,1.0);
  geometry.br = local_210;
  geometry.tl = local_218;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry,local_228);
  pNVar4 = rengine::Node::operator<<(pNVar4,pNVar5);
  rVar7 = rengine::rect2d::fromXywh(0.5,0.2,0.3,0.3);
  local_230 = rVar7.br;
  local_238 = rVar7.tl;
  rengine::vec4::vec4(&local_248,1.0,0.0,1.0,1.0);
  rVar7.br = local_230;
  rVar7.tl = local_238;
  pNVar5 = (Node *)rengine::RectangleNode::create(rVar7,local_248);
  pNVar4 = rengine::Node::operator<<(pNVar4,pNVar5);
  rVar7 = rengine::rect2d::fromXywh(-0.8,-0.5,0.65,1.0);
  pTVar6 = (TextureNode *)
           std::unique_ptr<rengine::Texture,_std::default_delete<rengine::Texture>_>::get
                     (&this->m_texture);
  pTVar6 = rengine::TextureNode::create(pTVar6,rVar7,(Texture *)pNVar5);
  pNVar4 = rengine::Node::operator<<(pNVar4,(Node *)pTVar6);
  local_138 = rengine::Node::operator<<(&this_02->super_Node,pNVar4);
  rengine::Node::append((Node *)this,local_138);
  std::
  shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
  ::~shared_ptr((shared_ptr<rengine::Animation<rengine::BlurNode,_unsigned_int,_&rengine::BlurNode::setRadius,_&rengine::AnimationCurves::smooth>_>
                 *)local_40);
  return;
}

Assistant:

void initialize() override {
        m_texture.reset(ImageUtils::load(renderer(), "walker.png"));

        vec2 s = size();
        float w2 = s.x / 2.0f;
        float h2 = s.y / 2.0f;
        float s2 = std::min(w2, h2);

        BlurNode *blurNode = BlurNode::create(37);

        auto a = make_shared<Animation_BlurNode_radius>(blurNode);
        a->setDuration(2);
        a->setDirection(AbstractAnimation::Alternate);
        a->setIterations(-1);
        a->newKeyFrame(0) = 0;
        a->newKeyFrame(1) = 100;

        animationManager()->start(a);
        m_animation = a;

        mat4 matrix = mat4::translate2D(w2, h2)
                      * mat4::scale2D(s2, s2);
        Node *root = &(*TransformNode::create(matrix)
                    << &(*blurNode
                       << RectangleNode::create(rect2d::fromXywh(0.15, -0.5,  0.3, 0.3), vec4(1, 0, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh(0.15, -0.15, 0.3, 0.3), vec4(0, 1, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh(0.15,  0.2,  0.3, 0.3), vec4(0, 0, 1, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5, -0.5,  0.3, 0.3), vec4(1, 1, 0, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5, -0.15, 0.3, 0.3), vec4(0, 1, 1, 1))
                       << RectangleNode::create(rect2d::fromXywh( 0.5,  0.2,  0.3, 0.3), vec4(1, 0, 1, 1))
                       << TextureNode::create(rect2d::fromXywh(-0.8, -0.5, 0.65, 1.0), m_texture.get())
                     )
                );
        append(root);
    }